

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  bool bVar1;
  size_t sVar2;
  int size;
  
  size = (int)value->_M_string_length;
  bVar1 = operator()(this,fp,&size);
  if (bVar1) {
    sVar2 = fwrite((value->_M_dataplus)._M_p,(long)size,1,(FILE *)fp);
    bVar1 = sVar2 == 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(FILE* fp, const string& value) {
    const int size = value.size();
    return (*this)(fp, size) && fwrite(value.c_str(), size, 1, fp) == 1;
  }